

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O1

void __thiscall
cmCPackNSISGenerator::CreateMenuLinks
          (cmCPackNSISGenerator *this,ostringstream *str,ostringstream *deleteStr)

{
  cmCPackLog *pcVar1;
  pointer pcVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  char *__s;
  size_t sVar6;
  ostream *poVar7;
  pointer pbVar8;
  string linkName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cpackMenuLinksVector;
  string desktop;
  ostringstream cmCPackLog_msg;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  cmCPackNSISGenerator *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_NSIS_MENU_LINKS","");
  __s = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (__s != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The cpackMenuLinks: ",0x14);
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    plVar3 = local_208;
    sVar6 = strlen((char *)local_208);
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,599,(char *)plVar3,sVar6);
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8._0_8_ = local_1a8 + 0x10;
    sVar6 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s,__s + sVar6);
    cmSystemTools::ExpandListArgument((string *)local_1a8,&local_1e8,false);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (((int)local_1e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
         (int)local_1e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start & 0x20U) == 0) {
      local_1d0 = this;
      if ((CreateMenuLinks(std::__cxx11::ostringstream&,std::__cxx11::ostringstream&)::urlRegex ==
           '\0') &&
         (iVar5 = __cxa_guard_acquire(&CreateMenuLinks(std::__cxx11::ostringstream&,std::__cxx11::ostringstream&)
                                       ::urlRegex), iVar5 != 0)) {
        CreateMenuLinks::urlRegex.program = (char *)0x0;
        cmsys::RegularExpression::compile
                  (&CreateMenuLinks::urlRegex,"^(mailto:|(ftps?|https?|news)://).*$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&CreateMenuLinks::urlRegex,
                     &__dso_handle);
        __cxa_guard_release(&CreateMenuLinks(std::__cxx11::ostringstream&,std::__cxx11::ostringstream&)
                             ::urlRegex);
      }
      if (local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar8 = local_1e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_1a8._0_8_ = local_1a8 + 0x10;
          pcVar2 = (pbVar8->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar2,pcVar2 + pbVar8->_M_string_length);
          bVar4 = cmsys::RegularExpression::find(&CreateMenuLinks::urlRegex,(char *)local_1a8._0_8_)
          ;
          if (!bVar4) {
            cmsys::SystemTools::ReplaceString((string *)local_1a8,"/","\\");
          }
          local_208 = local_1f8;
          pcVar2 = pbVar8[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,pcVar2,pcVar2 + pbVar8[1]._M_string_length);
          if (bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)str,"  WriteINIStr \"$SMPROGRAMS\\$STARTMENU_FOLDER\\",0x2d);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)str,(char *)local_208,local_200);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,".url\" \"InternetShortcut\" \"URL\" \"",0x20);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)local_1a8._0_8_,local_1a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)deleteStr,"  Delete \"$SMPROGRAMS\\$MUI_TEMP\\",0x20);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)deleteStr,(char *)local_208,local_200);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,".url\"",5);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)str,"  CreateShortCut \"$SMPROGRAMS\\$STARTMENU_FOLDER\\",0x30);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)str,(char *)local_208,local_200);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,".lnk\" \"$INSTDIR\\",0x10);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)local_1a8._0_8_,local_1a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)deleteStr,"  Delete \"$SMPROGRAMS\\$MUI_TEMP\\",0x20);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)deleteStr,(char *)local_208,local_200);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,".lnk\"",5);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          }
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1c8,"CPACK_CREATE_DESKTOP_LINK_","");
          std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_208);
          bVar4 = cmCPackGenerator::IsSet(&local_1d0->super_cmCPackGenerator,&local_1c8);
          if (bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)str,"  StrCmp \"$INSTALL_DESKTOP\" \"1\" 0 +2\n",0x25);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)str,"    CreateShortCut \"$DESKTOP\\",0x1d);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)str,(char *)local_208,local_200);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,".lnk\" \"$INSTDIR\\",0x10);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)local_1a8._0_8_,local_1a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)deleteStr,"  StrCmp \"$INSTALL_DESKTOP\" \"1\" 0 +2\n",0x25);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)deleteStr,"    Delete \"$DESKTOP\\",0x15);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)deleteStr,(char *)local_208,local_200);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,".lnk\"",5);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          if (local_208 != local_1f8) {
            operator_delete(local_208,local_1f8[0] + 1);
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          pbVar8 = pbVar8 + 2;
        } while (pbVar8 != local_1e8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "CPACK_NSIS_MENU_LINKS should contain pairs of <shortcut target> and <shortcut label>."
                 ,0x55);
      std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      plVar3 = local_208;
      sVar6 = strlen((char *)local_208);
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                      ,0x260,(char *)plVar3,sVar6);
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e8);
  }
  return;
}

Assistant:

void cmCPackNSISGenerator::CreateMenuLinks( std::ostringstream& str,
                                            std::ostringstream& deleteStr)
{
  const char* cpackMenuLinks
    = this->GetOption("CPACK_NSIS_MENU_LINKS");
  if(!cpackMenuLinks)
    {
    return;
    }
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "The cpackMenuLinks: "
                << cpackMenuLinks << "." << std::endl);
  std::vector<std::string> cpackMenuLinksVector;
  cmSystemTools::ExpandListArgument(cpackMenuLinks,
                                    cpackMenuLinksVector);
  if ( cpackMenuLinksVector.size() % 2 != 0 )
    {
    cmCPackLogger(
      cmCPackLog::LOG_ERROR,
      "CPACK_NSIS_MENU_LINKS should contain pairs of <shortcut target> and "
      "<shortcut label>." << std::endl);
    return;
    }

  static cmsys::RegularExpression
    urlRegex("^(mailto:|(ftps?|https?|news)://).*$");

  std::vector<std::string>::iterator it;
  for ( it = cpackMenuLinksVector.begin();
        it != cpackMenuLinksVector.end();
        ++it )
    {
    std::string sourceName = *it;
    const bool url = urlRegex.find(sourceName);

    // Convert / to \ in filenames, but not in urls:
    //
    if(!url)
      {
      cmSystemTools::ReplaceString(sourceName, "/", "\\");
      }

    ++ it;
    std::string linkName = *it;
    if(!url)
      {
      str << "  CreateShortCut \"$SMPROGRAMS\\$STARTMENU_FOLDER\\"
          << linkName << ".lnk\" \"$INSTDIR\\" << sourceName << "\""
          << std::endl;
      deleteStr << "  Delete \"$SMPROGRAMS\\$MUI_TEMP\\" << linkName
                << ".lnk\"" << std::endl;
      }
    else
      {
      str << "  WriteINIStr \"$SMPROGRAMS\\$STARTMENU_FOLDER\\"
          << linkName << ".url\" \"InternetShortcut\" \"URL\" \""
          << sourceName << "\""
          << std::endl;
      deleteStr << "  Delete \"$SMPROGRAMS\\$MUI_TEMP\\" << linkName
                << ".url\"" << std::endl;
      }
    // see if CPACK_CREATE_DESKTOP_LINK_ExeName is on
    // if so add a desktop link
    std::string desktop = "CPACK_CREATE_DESKTOP_LINK_";
    desktop += linkName;
    if(this->IsSet(desktop))
      {
      str << "  StrCmp \"$INSTALL_DESKTOP\" \"1\" 0 +2\n";
      str << "    CreateShortCut \"$DESKTOP\\"
          << linkName << ".lnk\" \"$INSTDIR\\" << sourceName << "\""
          << std::endl;
      deleteStr << "  StrCmp \"$INSTALL_DESKTOP\" \"1\" 0 +2\n";
      deleteStr << "    Delete \"$DESKTOP\\" << linkName
                << ".lnk\"" << std::endl;
      }
    }
}